

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

Context_conflict *
build_context(char *filename,char *source,uint sourcelen,MOJOSHADER_preprocessorDefine *defines,
             uint define_count,MOJOSHADER_includeOpen include_open,
             MOJOSHADER_includeClose include_close,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  Context_conflict *ctx_00;
  Buffer *pBVar1;
  ErrorList *pEVar2;
  Preprocessor *pPVar3;
  size_t mapblk;
  size_t outblk;
  Context_conflict *ctx;
  MOJOSHADER_includeOpen include_open_local;
  uint define_count_local;
  MOJOSHADER_preprocessorDefine *defines_local;
  uint sourcelen_local;
  char *source_local;
  char *filename_local;
  
  if (m == (MOJOSHADER_malloc)0x0) {
    m = MOJOSHADER_internal_malloc;
  }
  if (f == (MOJOSHADER_free)0x0) {
    f = MOJOSHADER_internal_free;
  }
  ctx = (Context_conflict *)include_open;
  if (include_open == (MOJOSHADER_includeOpen)0x0) {
    ctx = (Context_conflict *)MOJOSHADER_internal_include_open;
  }
  if (include_close == (MOJOSHADER_includeClose)0x0) {
    include_close = MOJOSHADER_internal_include_close;
  }
  ctx_00 = (Context_conflict *)(*m)(0xf8,d);
  if (ctx_00 != (Context_conflict *)0x0) {
    memset(ctx_00,0,0xf8);
    ctx_00->malloc = m;
    ctx_00->free = f;
    ctx_00->malloc_data = d;
    ctx_00->current_position = -2;
    pBVar1 = buffer_create(0x400,MallocBridge,FreeBridge,ctx_00);
    ctx_00->output = pBVar1;
    if (ctx_00->output != (Buffer *)0x0) {
      pBVar1 = buffer_create(0x1000,MallocBridge,FreeBridge,ctx_00);
      ctx_00->token_to_source = pBVar1;
      if (ctx_00->token_to_source != (Buffer *)0x0) {
        pEVar2 = errorlist_create(MallocBridge,FreeBridge,ctx_00);
        ctx_00->errors = pEVar2;
        if (ctx_00->errors != (ErrorList *)0x0) {
          pPVar3 = preprocessor_start(filename,source,sourcelen,(MOJOSHADER_includeOpen)ctx,
                                      include_close,defines,define_count,1,MallocBridge,FreeBridge,
                                      ctx_00);
          ctx_00->preprocessor = pPVar3;
          if (ctx_00->preprocessor != (Preprocessor *)0x0) {
            return ctx_00;
          }
        }
      }
    }
    destroy_context(ctx_00);
  }
  return (Context_conflict *)0x0;
}

Assistant:

static Context *build_context(const char *filename,
                              const char *source, unsigned int sourcelen,
                              const MOJOSHADER_preprocessorDefine *defines,
                              unsigned int define_count,
                              MOJOSHADER_includeOpen include_open,
                              MOJOSHADER_includeClose include_close,
                              MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    if (!m) m = MOJOSHADER_internal_malloc;
    if (!f) f = MOJOSHADER_internal_free;
    if (!include_open) include_open = MOJOSHADER_internal_include_open;
    if (!include_close) include_close = MOJOSHADER_internal_include_close;

    Context *ctx = (Context *) m(sizeof (Context), d);
    if (ctx == NULL)
        return NULL;

    memset(ctx, '\0', sizeof (Context));
    ctx->malloc = m;
    ctx->free = f;
    ctx->malloc_data = d;
    ctx->current_position = MOJOSHADER_POSITION_BEFORE;

    const size_t outblk = sizeof (uint32) * 4 * 64; // 64 4-token instrs.
    ctx->output = buffer_create(outblk, MallocBridge, FreeBridge, ctx);
    if (ctx->output == NULL)
        goto build_context_failed;

    const size_t mapblk = sizeof (SourcePos) * 4 * 64; // 64 * 4-tokens.
    ctx->token_to_source = buffer_create(mapblk, MallocBridge, FreeBridge, ctx);
    if (ctx->token_to_source == NULL)
        goto build_context_failed;

    ctx->errors = errorlist_create(MallocBridge, FreeBridge, ctx);
    if (ctx->errors == NULL)
        goto build_context_failed;

    ctx->preprocessor = preprocessor_start(filename, source, sourcelen,
                                           include_open, include_close,
                                           defines, define_count, 1,
                                           MallocBridge, FreeBridge, ctx);

    if (ctx->preprocessor == NULL)
        goto build_context_failed;

    return ctx;

build_context_failed:  // ctx is allocated and zeroed before this is called.
    destroy_context(ctx);
    return NULL;
}